

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNConstBase::adjust_for_dyn(CTPNConstBase *this,tcpn_dyncomp_info *info)

{
  CTcPrsNode *pCVar1;
  CTPNDebugConst *in_RDI;
  CTcConstVal *in_stack_ffffffffffffffc8;
  
  pCVar1 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x25a9a2);
  CTPNDebugConst::CTPNDebugConst(in_RDI,in_stack_ffffffffffffffc8);
  return pCVar1;
}

Assistant:

CTcPrsNode *CTPNConstBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    /* convert to a debugger-constant */
    return new CTPNDebugConst(&val_);
}